

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_pred.c
# Opt level: O2

void uavs3d_if_ver_luma(pel *src,int i_src,pel *dst,int i_dst,int width,int height,s8 *coeff,
                       int max_val)

{
  int iVar1;
  pel *ppVar2;
  pel *ppVar3;
  pel *ppVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  pel *ppVar11;
  ulong uVar12;
  pel *local_50;
  
  lVar8 = (long)i_src;
  iVar6 = 0;
  uVar7 = (ulong)(uint)width;
  if (width < 1) {
    uVar7 = 0;
  }
  if (height < 1) {
    height = iVar6;
  }
  lVar9 = (long)src - (long)(i_src * 3);
  lVar10 = (long)src - (long)(i_src * 2);
  lVar5 = (long)src - lVar8;
  ppVar11 = src + i_src * 2;
  ppVar4 = src + i_src * 3;
  ppVar3 = src + (i_src << 2);
  ppVar2 = src + lVar8;
  local_50 = dst;
  for (; iVar6 != height; iVar6 = iVar6 + 1) {
    for (uVar12 = 0; uVar7 != uVar12; uVar12 = uVar12 + 1) {
      iVar1 = (int)((int)coeff[7] * (uint)ppVar3[uVar12] +
                    (int)coeff[6] * (uint)ppVar4[uVar12] +
                    (int)coeff[5] * (uint)ppVar11[uVar12] + (int)coeff[4] * (uint)ppVar2[uVar12] +
                    (int)coeff[3] * (uint)src[uVar12] +
                    (int)coeff[2] * (uint)*(byte *)(lVar5 + uVar12) +
                    (int)coeff[1] * (uint)*(byte *)(lVar10 + uVar12) +
                    (int)*coeff * (uint)*(byte *)(lVar9 + uVar12) + 0x20) >> 6;
      if (max_val <= iVar1) {
        iVar1 = max_val;
      }
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      local_50[uVar12] = (pel)iVar1;
    }
    src = src + lVar8;
    local_50 = local_50 + i_dst;
    lVar9 = lVar9 + lVar8;
    lVar10 = lVar10 + lVar8;
    lVar5 = lVar5 + lVar8;
    ppVar2 = ppVar2 + lVar8;
    ppVar11 = ppVar11 + lVar8;
    ppVar4 = ppVar4 + lVar8;
    ppVar3 = ppVar3 + lVar8;
  }
  return;
}

Assistant:

static void uavs3d_if_ver_luma(const pel *src, int i_src, pel *dst, int i_dst, int width, int height, s8 const *coeff, int max_val)
{
    int row, col;
    int sum, val;

    for (row = 0; row < height; row++) {
        for (col = 0; col < width; col++) {
            sum = FLT_8TAP_VER(src, col, i_src, coeff);
            val = (sum + 32) >> 6;
            dst[col] = COM_CLIP3(0, max_val, val);
        }
        src += i_src;
        dst += i_dst;
    }
}